

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.cpp
# Opt level: O1

bool Input::getMouse(int button)

{
  Input *__s;
  
  if (instance == (Input *)0x0) {
    __s = (Input *)operator_new(0x440);
    __s->mouseX = 0.0;
    __s->mouseY = 0.0;
    memset(__s,0,0x429);
    instance = __s;
  }
  return instance->mouse[button];
}

Assistant:

bool Input::getMouse(int button)
{
	return Input::getInstance()->mouse[button];
}